

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::RegexPattern::IsSticky(RegexPattern *this)

{
  bool bVar1;
  
  if (((((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
      threadConfig)->m_ES6RegExSticky == true) {
    bVar1 = (bool)((((this->rep).unified.program.ptr)->flags & StickyRegexFlag) >> 4);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RegexPattern::IsSticky() const
    {
        return GetScriptContext()->GetConfig()->IsES6RegExStickyEnabled() && (rep.unified.program->flags & StickyRegexFlag) != 0;
    }